

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O3

void nhr_request_wait_raw_response(nhr_request r)

{
  nhr_bool nVar1;
  nhr_mutex mutex;
  
  nVar1 = nhr_request_recv(r);
  if (nVar1 != '\0') {
    if ((r->response != (nhr_response)0x0) && (r->response->is_finished != '\0')) {
      nhr_mutex_lock(r->command_mutex);
      r->command = 5;
      nhr_mutex_unlock(r->command_mutex);
    }
    nhr_request_check_timeout(r);
    return;
  }
  if (r == (nhr_request)0x0) {
    _DAT_00000048 = 2;
    nhr_mutex_lock(_DAT_00000080);
    _DAT_00000030 = 6;
    mutex = _DAT_00000080;
  }
  else {
    nhr_mutex_lock(r->command_mutex);
    r->command = 5;
    mutex = r->command_mutex;
  }
  nhr_mutex_unlock(mutex);
  return;
}

Assistant:

void nhr_request_wait_raw_response(nhr_request r) {
	nhr_bool is_finished = nhr_false;
	if (nhr_request_recv(r)) {
		is_finished = r->response ? r->response->is_finished : nhr_false;
		if (is_finished) {
			nhr_request_set_command(r, NHR_COMMAND_INFORM_RESPONSE);
		}
		if (!nhr_request_check_timeout(r)) {
			return; // error already exists
		}
	} else if (r) {
		nhr_request_set_command(r, NHR_COMMAND_INFORM_RESPONSE);
	} else {
		r->error_code = nhr_error_code_failed_connect_to_host;
		nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
	}
}